

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_encoder_factory.cc
# Opt level: O2

PredictionSchemeMethod draco::GetPredictionMethodFromOptions(int att_id,EncoderOptions *options)

{
  PredictionSchemeMethod PVar1;
  PredictionSchemeMethod PVar2;
  allocator<char> local_3d;
  int att_id_local;
  string local_38;
  
  att_id_local = att_id;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"prediction_scheme",&local_3d);
  PVar1 = DracoOptions<int>::GetAttributeInt
                    (&options->super_DracoOptions<int>,&att_id_local,&local_38,-1);
  std::__cxx11::string::~string((string *)&local_38);
  PVar2 = PREDICTION_NONE;
  if ((uint)PVar1 < 7) {
    PVar2 = PVar1;
  }
  if (PVar1 == PREDICTION_UNDEFINED) {
    PVar2 = PVar1;
  }
  return PVar2;
}

Assistant:

PredictionSchemeMethod GetPredictionMethodFromOptions(
    int att_id, const EncoderOptions &options) {
  const int pred_type =
      options.GetAttributeInt(att_id, "prediction_scheme", -1);
  if (pred_type == -1) {
    return PREDICTION_UNDEFINED;
  }
  if (pred_type < 0 || pred_type >= NUM_PREDICTION_SCHEMES) {
    return PREDICTION_NONE;
  }
  return static_cast<PredictionSchemeMethod>(pred_type);
}